

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_wad.c
# Opt level: O2

void * WAD_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  int iVar1;
  int iVar2;
  void *opaque;
  void *pvVar3;
  PHYSFS_uint32 count;
  PHYSFS_uint32 size;
  PHYSFS_uint32 directoryOffset;
  PHYSFS_uint32 pos;
  PHYSFS_uint8 buf [4];
  char local_39 [8];
  undefined1 local_31;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_wad.c"
                  ,0x51,"void *WAD_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,buf,4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    if ((buf == (PHYSFS_uint8  [4])0x44415749) || (buf == (PHYSFS_uint8  [4])0x44415750)) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&count,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      count = PHYSFS_swapULE32(count);
      iVar1 = __PHYSFS_readAll(io,&directoryOffset,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      directoryOffset = PHYSFS_swapULE32(directoryOffset);
      iVar1 = (*io->seek)(io,(ulong)directoryOffset);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      opaque = UNPK_openArchive(io,0,1);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      iVar1 = count + 1;
      do {
        iVar1 = iVar1 + -1;
        if (iVar1 == 0) {
          return opaque;
        }
        iVar2 = __PHYSFS_readAll(io,&pos,4);
        if (((iVar2 == 0) || (iVar2 = __PHYSFS_readAll(io,&size,4), iVar2 == 0)) ||
           (iVar2 = __PHYSFS_readAll(io,local_39,8), iVar2 == 0)) break;
        local_31 = 0;
        size = PHYSFS_swapULE32(size);
        pos = PHYSFS_swapULE32(pos);
        pvVar3 = UNPK_addEntry(opaque,local_39,0,-1,-1,(ulong)pos,(ulong)size);
      } while (pvVar3 != (void *)0x0);
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *WAD_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint32 count;
    PHYSFS_uint32 directoryOffset;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if ((memcmp(buf, "IWAD", 4) != 0) && (memcmp(buf, "PWAD", 4) != 0))
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE32(count);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &directoryOffset, 4), 0);
    directoryOffset = PHYSFS_swapULE32(directoryOffset);

    BAIL_IF_ERRPASS(!io->seek(io, directoryOffset), 0);

    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!wadLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}